

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall xLearn::OndiskReader::SetShuffle(OndiskReader *this,bool shuffle)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if ((int)CONCAT71(in_register_00000031,shuffle) != 0) {
    local_4c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.h"
               ,&local_4d);
    std::__cxx11::string::string((string *)&local_48,"SetShuffle",&local_4e);
    poVar1 = Logger::Start(ERR,&local_28,0x120,&local_48);
    std::operator<<(poVar1,"Cannot set shuffle for OndiskReader.");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    Logger::~Logger(&local_4c);
  }
  (this->super_Reader).shuffle_ = false;
  return;
}

Assistant:

void inline SetShuffle(bool shuffle) {
    if (shuffle == true) {
      LOG(ERR) << "Cannot set shuffle for OndiskReader.";
    }
    this->shuffle_ = false;
  }